

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

bool image_manipulation::bicubic_resize
               (clip_image_u8 *img,clip_image_u8 *dst,int target_width,int target_height)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  pointer puVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float C [5];
  float local_d8 [8];
  long local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  clip_image_u8 *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar2 = img->nx;
  iVar3 = img->ny;
  dst->nx = target_width;
  dst->ny = target_height;
  local_78 = &dst->buf;
  local_80 = img;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_78,(long)(target_width * target_height * 3));
  iVar14 = iVar3 + -1;
  uVar7 = uVar2 - 1;
  local_98 = 0;
  if (0 < target_width) {
    local_98 = (ulong)(uint)target_width;
  }
  local_b8 = (long)target_width;
  uVar12 = target_height;
  if (target_height < 1) {
    uVar12 = 0;
  }
  local_b0 = (ulong)uVar12;
  local_88 = (ulong)uVar2;
  for (local_a0 = 0; local_a0 != local_b0; local_a0 = local_a0 + 1) {
    fVar17 = (float)(int)local_a0 * ((float)iVar3 / (float)target_height);
    local_58 = fVar17 - (float)(int)fVar17;
    local_70 = (ulong)((int)fVar17 - 1);
    local_a8 = local_a0 * local_b8;
    uStack_54 = in_XMM1_Db;
    uStack_50 = in_XMM1_Dc;
    uStack_4c = in_XMM1_Dd;
    for (local_90 = 0; local_90 != local_98; local_90 = local_90 + 1) {
      local_48 = (float)(int)local_90 * ((float)(int)uVar2 / (float)target_width);
      uVar10 = (uint)local_48;
      uVar12 = uVar10 - 1;
      if ((int)uVar7 < (int)(uVar10 - 1)) {
        uVar12 = uVar7;
      }
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      local_60 = (ulong)uVar12;
      uVar12 = uVar10;
      if ((int)uVar7 < (int)uVar10) {
        uVar12 = uVar7;
      }
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      local_68 = (ulong)uVar12;
      uVar12 = uVar10 + 1;
      if ((int)uVar7 < (int)(uVar10 + 1)) {
        uVar12 = uVar7;
      }
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      uVar11 = uVar10 + 2;
      if ((int)uVar7 < (int)(uVar10 + 2)) {
        uVar11 = uVar7;
      }
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      local_48 = local_48 - (float)(int)local_48;
      lVar9 = local_a8 + local_90;
      uStack_44 = in_XMM1_Db;
      uStack_40 = in_XMM1_Dc;
      uStack_3c = in_XMM1_Dd;
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          iVar8 = (int)local_70 + (int)lVar13;
          if (iVar14 < iVar8) {
            iVar8 = iVar14;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          iVar8 = iVar8 * (int)local_88;
          puVar4 = (local_80->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar1 = puVar4[(long)((int)local_68 + iVar8) * 3 + lVar15];
          fVar5 = (float)(int)((uint)puVar4[(long)((int)local_60 + iVar8) * 3 + lVar15] -
                              (uint)bVar1);
          fVar6 = (float)(int)((uint)puVar4[(long)(int)(iVar8 + uVar12) * 3 + lVar15] - (uint)bVar1)
          ;
          fVar16 = (float)(int)((uint)puVar4[(long)(int)(iVar8 + uVar11) * 3 + lVar15] - (uint)bVar1
                               );
          fVar17 = fVar6 * 0.5;
          local_d8[lVar13] =
               (fVar16 * 0.16666667 + (fVar5 * -0.16666667 - fVar17)) * local_48 * local_48 *
               local_48 +
               (fVar5 * 0.5 + fVar17) * local_48 * local_48 +
               (fVar16 * -0.16666667 + fVar5 * -0.33333334 + fVar6) * local_48 + (float)bVar1;
          fVar16 = local_d8[0] - local_d8[1];
          fVar17 = (local_d8[2] - local_d8[1]) * 0.5;
          fVar16 = roundf(((local_d8[3] - local_d8[1]) * 0.16666667 +
                          (fVar16 * -0.16666667 - fVar17)) * local_58 * local_58 * local_58 +
                          (fVar16 * 0.5 + fVar17) * local_58 * local_58 +
                          ((local_d8[3] - local_d8[1]) * -0.16666667 +
                          fVar16 * -0.33333334 + (local_d8[2] - local_d8[1])) * local_58 +
                          local_d8[1]);
          in_XMM1_Db = 0;
          in_XMM1_Dc = 0;
          in_XMM1_Dd = 0;
          fVar17 = 0.0;
          if (0.0 <= fVar16) {
            fVar17 = fVar16;
          }
          fVar16 = 255.0;
          if (fVar17 <= 255.0) {
            fVar16 = fVar17;
          }
          (local_78->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar9 * 3 + lVar15] = (uchar)(int)fVar16;
        }
      }
    }
  }
  return true;
}

Assistant:

static bool bicubic_resize(const clip_image_u8 & img, clip_image_u8 & dst, int target_width, int target_height) {
        const int nx = img.nx;
        const int ny = img.ny;

        dst.nx = target_width;
        dst.ny = target_height;
        dst.buf.resize(3 * target_width * target_height);

        float Cc;
        float C[5];
        float d0, d2, d3, a0, a1, a2, a3;
        int i, j, k, jj;
        int x, y;
        float dx, dy;
        float tx, ty;

        tx = (float)nx / (float)target_width;
        ty = (float)ny / (float)target_height;

        // Bicubic interpolation; adapted from ViT.cpp, inspired from :
        //    -> https://github.com/yglukhov/bicubic-interpolation-image-processing/blob/master/libimage.c#L36
        //    -> https://en.wikipedia.org/wiki/Bicubic_interpolation

        for (i = 0; i < target_height; i++) {
            for (j = 0; j < target_width; j++) {
                x = (int)(tx * j);
                y = (int)(ty * i);

                dx = tx * j - x;
                dy = ty * i - y;

                for (k = 0; k < 3; k++) {
                    for (jj = 0; jj <= 3; jj++) {
                        d0 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x - 1, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        d2 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x + 1, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        d3 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x + 2, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        a0 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];

                        a1 = -1.0 / 3 * d0 + d2 - 1.0 / 6 * d3;
                        a2 =  1.0 / 2 * d0 +      1.0 / 2 * d2;
                        a3 = -1.0 / 6 * d0 -      1.0 / 2 * d2 + 1.0 / 6 * d3;

                        C[jj] = a0 + a1 * dx + a2 * dx * dx + a3 * dx * dx * dx;

                        d0 = C[0] - C[1];
                        d2 = C[2] - C[1];
                        d3 = C[3] - C[1];
                        a0 = C[1];
                        a1 = -1.0 / 3 * d0 + d2 - 1.0 / 6 * d3;
                        a2 =  1.0 / 2 * d0 +      1.0 / 2 * d2;
                        a3 = -1.0 / 6 * d0 -      1.0 / 2 * d2 + 1.0 / 6 * d3;
                        Cc = a0 + a1 * dy + a2 * dy * dy + a3 * dy * dy * dy;

                        const uint8_t Cc2 = std::min(std::max(std::round(Cc), 0.0f), 255.0f);
                        dst.buf[(i * target_width + j) * 3 + k] = float(Cc2);
                    }
                }
            }
        }

        return true;
    }